

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_MMDP_OnlineSolve.cpp
# Opt level: O0

double runSimulations(PlanningUnitDecPOMDPDiscrete *pu,SimulationDecPOMDPDiscrete *sim)

{
  _Setprecision _Var1;
  ulong uVar2;
  ulong uVar3;
  AgentQLearner *pAVar4;
  reference ppAVar5;
  ostream *poVar6;
  basic_ostream<char,_std::char_traits<char>_> *this;
  vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> *this_00;
  vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> *pvVar7;
  long *in_RDI;
  double dVar8;
  matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  *this_01;
  vector_expression<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
  *in_stack_00000048;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_00000050;
  Index i_1;
  double avgReward;
  row_t row;
  QTable q;
  SimulationResult result;
  Index i;
  vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> agents;
  AgentQLearner *newAgent;
  AgentQLearner agent;
  AgentQLearner *in_stack_fffffffffffffe18;
  vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> *in_stack_fffffffffffffe20
  ;
  Index s_i;
  QTable *in_stack_fffffffffffffe28;
  uint local_16c;
  SimulationResult local_118 [48];
  AgentQLearner *local_e8;
  uint local_cc;
  vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> local_c8;
  AgentQLearner *local_b0;
  AgentQLearner local_a8 [16];
  vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> *in_stack_ffffffffffffff68
  ;
  SimulationDecPOMDPDiscrete *in_stack_ffffffffffffff70;
  
  dVar8 = PlanningUnitDecPOMDPDiscrete::GetDiscount((PlanningUnitDecPOMDPDiscrete *)0x107161);
  AgentQLearner::AgentQLearner
            ((AgentQLearner *)0x0,0x3fb999999999999a,0x3feccccccccccccd,dVar8,0x3fd999999999999a,
             local_a8,in_RDI,0,2);
  std::vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>::vector
            ((vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> *)0x1071a7);
  local_cc = 0;
  while( true ) {
    uVar2 = (ulong)local_cc;
    uVar3 = (**(code **)(*in_RDI + 0x30))();
    if (uVar3 <= uVar2) break;
    pAVar4 = (AgentQLearner *)operator_new(0x98);
    AgentQLearner::AgentQLearner(pAVar4,local_a8);
    local_b0 = pAVar4;
    (**(code **)(*(long *)(pAVar4 + *(long *)(*(long *)pAVar4 + -0x18)) + 0x18))
              (pAVar4 + *(long *)(*(long *)pAVar4 + -0x18),local_cc);
    local_e8 = local_b0;
    std::vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>::push_back
              (in_stack_fffffffffffffe20,(value_type *)in_stack_fffffffffffffe18);
    pAVar4 = local_b0;
    ppAVar5 = std::vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>::
              operator[](&local_c8,0);
    AgentQLearner::SetFirstAgent(pAVar4,(AgentQLearner *)*ppAVar5);
    local_cc = local_cc + 1;
  }
  SimulationDecPOMDPDiscrete::RunSimulations<AgentFullyObservable>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  s_i = (Index)((ulong)in_stack_fffffffffffffe20 >> 0x20);
  std::vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>::operator[]
            (&local_c8,0);
  AgentQLearner::GetQTable(in_stack_fffffffffffffe18);
  QTable::GetRow(in_stack_fffffffffffffe28,s_i);
  _Var1 = std::setprecision(7);
  poVar6 = std::operator<<((ostream *)&std::cout,_Var1);
  std::operator<<(poVar6,"Here\'s first row (state 0) from Q-learning result: \n");
  this = boost::numeric::ublas::operator<<(in_stack_00000050,in_stack_00000048);
  std::ostream::operator<<((ostream *)this,std::endl<char,std::char_traits<char>>);
  this_01 = (matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
             *)SimulationResult::GetAvgReward(local_118);
  local_16c = 0;
  while( true ) {
    this_00 = (vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> *)
              (ulong)local_16c;
    pvVar7 = (vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> *)
             (**(code **)(*in_RDI + 0x30))();
    if (pvVar7 <= this_00) break;
    ppAVar5 = std::vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>::
              operator[](&local_c8,(ulong)local_16c);
    if (*ppAVar5 != (value_type)0x0) {
      (**(code **)(*(long *)*ppAVar5 + 8))();
    }
    local_16c = local_16c + 1;
  }
  boost::numeric::ublas::
  matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  ::~matrix_row(this_01);
  QTable::~QTable((QTable *)this_01);
  SimulationResult::~SimulationResult(local_118);
  std::vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>::~vector(this_00);
  AgentQLearner::~AgentQLearner(local_a8);
  return (double)this_01;
}

Assistant:

double runSimulations(const PlanningUnitDecPOMDPDiscrete *pu,
                      const SimulationDecPOMDPDiscrete &sim)
{
    // create 'template' agent from which others are created
    AgentQLearner agent(pu, 0, 0.0, 0.1, 0.9, pu->GetDiscount());

    AgentQLearner *newAgent;
    vector<AgentFullyObservable*> agents;

    for(Index i=0; i < pu->GetNrAgents(); i++)
    {
        newAgent=new AgentQLearner(agent);
        newAgent->SetIndex(i);
        agents.push_back(newAgent);
        
        // Only one agent, id 0, is learning the joint policy in this example.
        // Others merely look up their action component from that joint learner.
        newAgent->SetFirstAgent(static_cast<AgentQLearner*>(agents[0]));
    }
    SimulationResult result = sim.RunSimulations(agents);

    QTable q = static_cast<AgentQLearner*>(agents[0])->GetQTable();
    row_t row   = q.GetRow(0);
    cout << setprecision(7)
         << "Here's first row (state 0) from Q-learning result: \n" << row << endl;

    double avgReward = result.GetAvgReward();
    for(Index i=0; i < pu->GetNrAgents(); i++)
        delete agents[i];

    return avgReward;
}